

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_2>::Run
          (AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_2> *this)

{
  GLuint GVar1;
  bool bVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLenum GVar5;
  GLenum GVar6;
  undefined1 local_f8 [8];
  ivec4 res [7];
  undefined1 local_80 [8];
  ImageSizeMachine machine;
  int i;
  GLenum target [7];
  AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_2> *this_local;
  
  unique0x100015e1 = this;
  bVar2 = ShaderImageSizeBase::SupportedInStage(&this->super_ShaderImageSizeBase,2,8);
  if (bVar2) {
    target[0] = 0x9009;
    target[1] = 0x9009;
    target[2] = 0x84f5;
    target[3] = 0x8c1a;
    target[4] = 0x8c2a;
    for (machine.m_texture = 0; (int)machine.m_texture < 7;
        machine.m_texture = machine.m_texture + 1) {
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,target[(long)(int)machine.m_texture + -2],
                 this->m_texture[(int)machine.m_texture]);
      if (target[(long)(int)machine.m_texture + -2] != 0x8c2a) {
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,target[(long)(int)machine.m_texture + -2],0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,target[(long)(int)machine.m_texture + -2],0x2800,0x2600);
      }
      if (machine.m_texture == 0) {
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar4 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c1a,0,GVar3,2,2,7,0,GVar4,GVar5,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,1,GVar4,1,1,7,0,GVar5,GVar6,(void *)0x0);
        GVar1 = this->m_texture[(int)machine.m_texture];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,GVar1,1,'\0',3,35000,GVar3);
      }
      else if (machine.m_texture == 1) {
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar4 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x806f,0,GVar3,4,4,2,0,GVar4,GVar5,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,1,GVar4,2,2,1,0,GVar5,GVar6,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,2,GVar4,1,1,1,0,GVar5,GVar6,(void *)0x0);
        GVar1 = this->m_texture[(int)machine.m_texture];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,2,GVar1,1,'\x01',0,35000,GVar3);
      }
      else if (machine.m_texture == 2) {
        GVar3 = target[0];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,0,GVar4,2,2,0xc,0,GVar5,GVar6,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,1,GVar4,1,1,0xc,0,GVar5,GVar6,(void *)0x0);
        GVar1 = this->m_texture[(int)machine.m_texture];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,3,GVar1,0,'\0',1,0x88ba,GVar3);
      }
      else if (machine.m_texture == 3) {
        GVar3 = target[1];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,0,GVar4,4,4,0x12,0,GVar5,GVar6,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,1,GVar4,2,2,0x12,0,GVar5,GVar6,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,2,GVar4,1,1,0x12,0,GVar5,GVar6,(void *)0x0);
        GVar1 = this->m_texture[(int)machine.m_texture];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,4,GVar1,1,'\x01',0,35000,GVar3);
      }
      else if (machine.m_texture == 4) {
        GVar3 = target[2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage2D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,0,GVar4,0x7b,0xb,0,GVar5,GVar6,(void *)0x0);
        GVar1 = this->m_texture[(int)machine.m_texture];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,GVar1,0,'\0',0,0x88ba,GVar3);
      }
      else if (machine.m_texture == 5) {
        GVar3 = target[3];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,0,GVar4,0xd,7,4,0,GVar5,GVar6,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,1,GVar4,6,3,4,0,GVar5,GVar6,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,2,GVar4,3,1,4,0,GVar5,GVar6,(void *)0x0);
        GVar3 = target[(long)(int)machine.m_texture + -2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        GVar5 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
        GVar6 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexImage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,3,GVar4,1,1,4,0,GVar5,GVar6,(void *)0x0);
        GVar1 = this->m_texture[(int)machine.m_texture];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,6,GVar1,1,'\x01',0,35000,GVar3);
      }
      else if (machine.m_texture == 6) {
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c2a,this->m_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c2a,0x400,(void *)0x0,0x88e4);
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glTexBufferRange
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c2a,GVar3,this->m_buffer,0x100,0x200);
        GVar1 = this->m_texture[(int)machine.m_texture];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,7,GVar1,0,'\0',0,0x88b9,GVar3);
      }
    }
    ImageSizeMachine::ImageSizeMachine((ImageSizeMachine *)local_80);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_f8,1,1,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[0].m_data + 2),2,2,1,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[1].m_data + 2),2,2,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[2].m_data + 2),2,2,3,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[3].m_data + 2),0x7b,0xb,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[4].m_data + 2),6,3,4,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[5].m_data + 2),0x20,0,0,0);
    this_local = (AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_2> *)
                 gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                           ((ImageSizeMachine *)local_80,2,false,(ivec4 *)local_f8,true);
    ImageSizeMachine::~ImageSizeMachine((ImageSizeMachine *)local_80);
  }
  else {
    this_local = (AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_2> *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 8))
			return NOT_SUPPORTED;

		const GLenum target[7] = { GL_TEXTURE_2D_ARRAY,		  GL_TEXTURE_3D,		GL_TEXTURE_CUBE_MAP_ARRAY,
								   GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_ARRAY,
								   GL_TEXTURE_BUFFER };
		for (int i = 0; i < 7; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] != GL_TEXTURE_BUFFER)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 2, 2, 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 1, 1, 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 3, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 4, 4, 2, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 2, 2, 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 1, 1, 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(2, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 2, 2, 12, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 1, 1, 12, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 1, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 4, 4, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 2, 2, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 1, 1, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(4, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 4)
			{
				glTexImage2D(target[i], 0, TexInternalFormat<T>(), 123, 11, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(5, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 5)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 13, 7, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 6, 3, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 3, 1, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 3, TexInternalFormat<T>(), 1, 1, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(6, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 6)
			{
				glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
				glBufferData(GL_TEXTURE_BUFFER, 1024, NULL, GL_STATIC_DRAW);
				glTexBufferRange(GL_TEXTURE_BUFFER, TexInternalFormat<T>(), m_buffer, 256, 512);
				glBindImageTexture(7, m_texture[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(1, 1, 0, 0),	ivec4(2, 2, 1, 0), ivec4(2, 2, 0, 0), ivec4(2, 2, 3, 0),
						 ivec4(123, 11, 0, 0), ivec4(6, 3, 4, 0), ivec4(32, 0, 0, 0) };
		return machine.Run<T>(STAGE, false, res, true);
	}